

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::SeparatedSyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }